

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O2

bool __thiscall Minisat::SimpSolver::implied(SimpSolver *this,vec<Minisat::Lit> *c)

{
  int iVar1;
  bool bVar2;
  undefined4 in_EAX;
  CRef CVar3;
  int i;
  long lVar4;
  undefined4 uStack_38;
  int local_34;
  
  _uStack_38 = CONCAT44((this->super_Solver).trail.sz,in_EAX);
  vec<int>::push(&(this->super_Solver).trail_lim,&local_34);
  lVar4 = 0;
  do {
    if (c->sz <= lVar4) {
      CVar3 = Solver::propagate(&this->super_Solver);
      bVar2 = CVar3 != 0xffffffff;
LAB_00126d98:
      Solver::cancelUntil(&this->super_Solver,0,false);
      return bVar2;
    }
    iVar1 = c->data[lVar4].x;
    uStack_38 = CONCAT13((byte)iVar1 & 1 ^ (this->super_Solver).assigns.data[iVar1 >> 1].value,
                         (undefined3)uStack_38);
    bVar2 = lbool::operator==((lbool *)((long)&uStack_38 + 3),(lbool)0x0);
    if (bVar2) {
      bVar2 = true;
      goto LAB_00126d98;
    }
    iVar1 = c->data[lVar4].x;
    uStack_38._0_3_ =
         CONCAT12((byte)iVar1 & 1 ^ (this->super_Solver).assigns.data[iVar1 >> 1].value,
                  (undefined2)uStack_38);
    bVar2 = lbool::operator!=((lbool *)((long)&uStack_38 + 2),(lbool)0x1);
    if (bVar2) {
      Solver::uncheckedEnqueue
                (&this->super_Solver,(Lit)(c->data[lVar4].x ^ 1),(this->super_Solver).trail_lim.sz,
                 0xffffffff);
    }
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

bool SimpSolver::implied(const vec<Lit> &c)
{
    assert(decisionLevel() == 0);

    trail_lim.push(trail.size());
    for (int i = 0; i < c.size(); i++)
        if (value(c[i]) == l_True) {
            cancelUntil(0);
            return true;
        } else if (value(c[i]) != l_False) {
            assert(value(c[i]) == l_Undef);
            uncheckedEnqueue(~c[i], decisionLevel());
        }

    bool result = propagate() != CRef_Undef;
    cancelUntil(0);
    return result;
}